

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::StandardPropertyCaseItemSyntax::StandardPropertyCaseItemSyntax
          (StandardPropertyCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          PropertyExprSyntax *expr,Token semi)

{
  PropertyExprSyntax *pPVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ExpressionSyntax *pEVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar6 = colon._0_8_;
  (this->super_PropertyCaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PropertyCaseItemSyntax).super_SyntaxNode.kind = StandardPropertyCaseItem;
  SVar3 = (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent =
       (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ed090;
  sVar2 = (expressions->elements).size_;
  (this->expressions).elements.data_ = (expressions->elements).data_;
  (this->expressions).elements.size_ = sVar2;
  (this->colon).kind = (short)uVar6;
  (this->colon).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->colon).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->colon).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->colon).info = colon.info;
  (this->expr).ptr = expr;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->expressions).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pEVar5 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                         (&this->expressions,index);
      (pEVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  pPVar1 = (this->expr).ptr;
  if (pPVar1 != (PropertyExprSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = (SyntaxNode *)this;
    return;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
            );
}

Assistant:

StandardPropertyCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, PropertyExprSyntax& expr, Token semi) :
        PropertyCaseItemSyntax(SyntaxKind::StandardPropertyCaseItem), expressions(expressions), colon(colon), expr(&expr), semi(semi) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->expr->parent = this;
    }